

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stbi_DDS_aug_c.h
# Opt level: O2

void stbi_decode_DXT23_alpha_block(uchar *uncompressed,uchar *compressed)

{
  int i;
  ulong uVar1;
  int iVar2;
  
  for (uVar1 = 3; uVar1 < 0x40; uVar1 = uVar1 + 4) {
    iVar2 = (compressed[uVar1 - 3 >> 3 & 0x1fffffff] >> ((byte)(uVar1 - 3) & 4) & 0xf) * 0xff;
    uncompressed[uVar1] = (uchar)(iVar2 + (iVar2 + 8U >> 4) + 8 >> 4);
  }
  return;
}

Assistant:

void stbi_decode_DXT23_alpha_block(
			unsigned char uncompressed[16*4],
			unsigned char compressed[8] )
{
	int i, next_bit = 0;
	//	each alpha value gets 4 bits
	for( i = 3; i < 16*4; i += 4 )
	{
		uncompressed[i] = stbi_convert_bit_range(
				(compressed[next_bit>>3] >> (next_bit&7)) & 15,
				4, 8 );
		next_bit += 4;
	}
}